

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_dup(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  undefined8 in_RAX;
  JSValueUnion JVar2;
  ulong uVar3;
  int64_t iVar4;
  JSValue JVar5;
  int fd;
  
  fd = (int)((ulong)in_RAX >> 0x20);
  iVar1 = JS_ToInt32(ctx,&fd,*argv);
  if (iVar1 == 0) {
    iVar1 = dup(fd);
    uVar3 = js_get_errno((long)iVar1);
    JVar2.ptr = (void *)(uVar3 & 0xffffffff);
    iVar4 = 0;
  }
  else {
    iVar4 = 6;
    JVar2.float64 = 0.0;
  }
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_dup(JSContext *ctx, JSValueConst this_val,
                         int argc, JSValueConst *argv)
{
    int fd, ret;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    ret = js_get_errno(dup(fd));
    return JS_NewInt32(ctx, ret);
}